

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<int,int,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,int *v,int v_min,int v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ImGuiDataType data_type_00;
  int iVar6;
  undefined8 unaff_RBX;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  ImVec2 IVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pIVar2 = GImGui;
  uVar7 = (ulong)(flags & 1);
  uVar8 = data_type & 0xfffffffe;
  bVar9 = uVar8 == 4;
  bVar10 = power != 1.0;
  iVar5 = (int)CONCAT71((int7)((ulong)v >> 8),NAN(power));
  uVar3 = v_min - v_max;
  uVar11 = -uVar3;
  if (0 < (int)uVar3) {
    uVar11 = uVar3;
  }
  fVar17 = (&(bb->Min).x)[uVar7];
  fVar13 = (&(bb->Max).x)[uVar7];
  fVar18 = (fVar13 - fVar17) + -4.0;
  fVar16 = (GImGui->Style).GrabMinSize;
  if (uVar8 != 4) {
    fVar15 = fVar18 / (float)(int)(uVar11 + 1);
    uVar3 = -(uint)(fVar16 <= fVar15);
    fVar16 = (float)(~uVar3 & (uint)fVar16 | (uint)fVar15 & uVar3);
  }
  if (fVar18 <= fVar16) {
    fVar16 = fVar18;
  }
  if (v_max * v_min < 0 && (bVar10 && bVar9)) {
    fVar15 = (float)v_min;
    if (v_min < 0) {
      fVar15 = -fVar15;
    }
    fVar15 = powf(fVar15,1.0 / power);
    fVar12 = (float)v_max;
    if (v_max < 0) {
      fVar12 = -fVar12;
    }
    fVar12 = powf(fVar12,1.0 / power);
    fVar15 = fVar15 / (fVar12 + fVar15);
  }
  else if (v_min < 0) {
    fVar15 = 1.0;
  }
  else {
    fVar15 = 0.0;
  }
  fVar17 = fVar17 + 2.0 + fVar16 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar14 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar18 = IVar14.x;
      if (uVar7 != 0) {
        fVar18 = -IVar14.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar18 != 0.0) || (NAN(fVar18))) {
        iVar5 = v_max;
        fVar12 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar15);
        if (uVar8 == 4) {
          iVar6 = ImParseFormatPrecision(format,3);
          iVar5 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),~(bVar10 && bVar9));
          if ((~(bVar10 && bVar9) & iVar6 < 1) != 0) goto LAB_00157f26;
          fVar18 = fVar18 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar18 = fVar18 / 10.0;
          }
        }
        else {
LAB_00157f26:
          if ((uVar11 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            iVar5 = 0x1953c8;
            fVar18 = *(float *)(&DAT_001953c8 + (ulong)(fVar18 < 0.0) * 4) / (float)(int)uVar11;
          }
          else {
            fVar18 = fVar18 / 100.0;
          }
        }
        uVar11 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar18 = (float)(~uVar11 & (uint)fVar18 | (uint)(fVar18 * 10.0) & uVar11);
        if (((fVar12 < 1.0) || (fVar18 <= 0.0)) && ((0.0 < fVar12 || (0.0 <= fVar18)))) {
          fVar12 = fVar12 + fVar18;
          fVar18 = 1.0;
          if (fVar12 <= 1.0) {
            fVar18 = fVar12;
          }
          fVar12 = (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar18);
          goto LAB_00157dcb;
        }
        bVar1 = false;
        goto LAB_0015802b;
      }
      fVar12 = 0.0;
      bVar1 = false;
    }
    else {
      fVar12 = 0.0;
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
          fVar12 = 0.0;
          bVar1 = false;
        }
        else {
          if (0.0 < fVar18 - fVar16) {
            fVar18 = (*(float *)((pIVar2->IO).MouseDown + uVar7 * 4 + -8) - fVar17) /
                     (fVar18 - fVar16);
            fVar12 = 1.0;
            if (fVar18 <= 1.0) {
              fVar12 = fVar18;
            }
            fVar12 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar12);
          }
          if (uVar7 != 0) {
            fVar12 = 1.0 - fVar12;
          }
LAB_00157dcb:
          bVar1 = true;
        }
      }
      else {
        bVar1 = false;
      }
    }
LAB_0015802b:
    if (bVar1) {
      if (bVar10 && bVar9) {
        if (fVar15 <= fVar12) {
          uVar11 = -(uint)(1e-06 < ABS(fVar15 + -1.0));
          fVar18 = powf((float)(~uVar11 & (uint)fVar12 |
                               (uint)((fVar12 - fVar15) / (1.0 - fVar15)) & uVar11),power);
          uVar11 = 0;
          iVar5 = v_max;
          if (0 < v_min) {
            uVar11 = v_min;
          }
        }
        else {
          fVar18 = powf(1.0 - fVar12 / fVar15,power);
          uVar11 = v_max >> 0x1f & v_max;
          iVar5 = v_min;
        }
        iVar5 = iVar5 - uVar11;
        data_type_00 = (ImGuiDataType)((float)iVar5 * fVar18 + (float)(int)uVar11);
      }
      else if (uVar8 == 4) {
        data_type_00 = (ImGuiDataType)((float)(v_max - v_min) * fVar12 + (float)v_min);
      }
      else {
        fVar12 = fVar12 * (float)(v_max - v_min);
        iVar4 = (int)fVar12;
        iVar6 = (int)(fVar12 + 0.5);
        if (iVar6 < iVar4) {
          iVar6 = iVar4;
        }
        data_type_00 = iVar6 + v_min;
      }
      iVar5 = RoundScalarWithFormatT<int,int>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,iVar5);
      bVar10 = *v != iVar5;
      if (bVar10) {
        *v = iVar5;
        bVar10 = true;
      }
      goto LAB_00158083;
    }
  }
  bVar10 = false;
LAB_00158083:
  fVar18 = SliderCalcRatioFromValueT<int,float>(data_type,*v,v_min,v_max,power,fVar15);
  if (uVar7 != 0) {
    fVar18 = 1.0 - fVar18;
  }
  fVar17 = (((fVar13 + -2.0) - fVar16 * 0.5) - fVar17) * fVar18 + fVar17;
  if (uVar7 == 0) {
    fVar18 = -fVar16 * 0.5 + fVar17;
    fVar15 = fVar16 * 0.5 + fVar17;
    fVar13 = (bb->Min).y + 2.0;
    fVar17 = (bb->Max).y + -2.0;
  }
  else {
    fVar18 = (bb->Min).x + 2.0;
    fVar15 = (bb->Max).x + -2.0;
    fVar13 = -fVar16 * 0.5 + fVar17;
    fVar17 = fVar16 * 0.5 + fVar17;
  }
  (out_grab_bb->Min).x = fVar18;
  (out_grab_bb->Min).y = fVar13;
  (out_grab_bb->Max).x = fVar15;
  (out_grab_bb->Max).y = fVar17;
  return bVar10;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}